

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentupdate.cpp
# Opt level: O1

void test_concurrent_update::read_total_balance(DuckDB *db,bool *read_correct)

{
  bool bVar1;
  initializer_list<duckdb::Value> __l;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  Connection con;
  allocator_type local_b1;
  long *local_b0;
  Connection local_a8 [32];
  undefined1 *local_88 [2];
  undefined1 local_78 [48];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_48;
  
  *read_correct = true;
  duckdb::Connection::Connection(local_a8,db);
  if ((finished_updating & 1) == 0) {
    do {
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,"SELECT SUM(money) FROM accounts","");
      duckdb::Connection::Query((string *)&local_b0);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      duckdb::Value::Value((Value *)local_88,100);
      __l._M_len = 1;
      __l._M_array = (Value *)local_88;
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_48,__l,&local_b1);
      bVar1 = duckdb::CHECK_COLUMN
                        ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                          *)&local_b0,0,(vector<duckdb::Value,_true> *)&local_48);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_48);
      duckdb::Value::~Value((Value *)local_88);
      if (!bVar1) {
        *read_correct = false;
      }
      if (local_b0 != (long *)0x0) {
        (**(code **)(*local_b0 + 8))();
      }
    } while ((finished_updating & 1) == 0);
  }
  duckdb::Connection::~Connection(local_a8);
  return;
}

Assistant:

static void read_total_balance(DuckDB *db, bool *read_correct) {
	*read_correct = true;
	Connection con(*db);
	while (!finished_updating) {
		// the total balance should remain constant regardless of updates
		auto result = con.Query("SELECT SUM(money) FROM accounts");
		if (!CHECK_COLUMN(result, 0, {CONCURRENT_UPDATE_TOTAL_ACCOUNTS * CONCURRENT_UPDATE_MONEY_PER_ACCOUNT})) {
			*read_correct = false;
		}
	}
}